

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::clear
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  delete_root_subtree(this);
  (this->root).tagged_ptr = 0;
  this->current_memory_use = 0;
  *(undefined1 (*) [32])((this->node_counts)._M_elems + 1) = ZEXT432(0) << 0x40;
  return;
}

Assistant:

void db<Key, Value>::clear() noexcept {
  delete_root_subtree();

  root = nullptr;
#ifdef UNODB_DETAIL_WITH_STATS
  current_memory_use = 0;
  node_counts[as_i<node_type::I4>] = 0;
  node_counts[as_i<node_type::I16>] = 0;
  node_counts[as_i<node_type::I48>] = 0;
  node_counts[as_i<node_type::I256>] = 0;
#endif  // UNODB_DETAIL_WITH_STATS
}